

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

void __thiscall capnp::LocalCallContext::~LocalCallContext(LocalCallContext *this)

{
  PromiseFulfiller<void> *pPVar1;
  Disposer *pDVar2;
  PromiseFulfiller<capnp::AnyPointer::Pipeline> *pPVar3;
  ClientHook *pCVar4;
  ResponseHook *pRVar5;
  MallocMessageBuilder *pMVar6;
  
  pPVar1 = (this->cancelAllowedFulfiller).ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
    (this->cancelAllowedFulfiller).ptr = (PromiseFulfiller<void> *)0x0;
    pDVar2 = (this->cancelAllowedFulfiller).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pPVar1->_vptr_PromiseFulfiller[-2] + (long)&pPVar1->_vptr_PromiseFulfiller);
  }
  pPVar3 = (this->tailCallPipelineFulfiller).ptr.ptr;
  if (pPVar3 != (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0) {
    (this->tailCallPipelineFulfiller).ptr.ptr = (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0
    ;
    pDVar2 = (this->tailCallPipelineFulfiller).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pPVar3->_vptr_PromiseFulfiller[-2] + (long)&pPVar3->_vptr_PromiseFulfiller);
  }
  pCVar4 = (this->clientRef).ptr;
  if (pCVar4 != (ClientHook *)0x0) {
    (this->clientRef).ptr = (ClientHook *)0x0;
    pDVar2 = (this->clientRef).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pCVar4->_vptr_ClientHook[-2] + (long)&pCVar4->_vptr_ClientHook);
  }
  if (((this->response).ptr.isSet == true) &&
     (pRVar5 = (this->response).ptr.field_1.value.hook.ptr, pRVar5 != (ResponseHook *)0x0)) {
    (this->response).ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
    pDVar2 = (this->response).ptr.field_1.value.hook.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pRVar5->_vptr_ResponseHook[-2] + (long)&pRVar5->_vptr_ResponseHook);
  }
  pMVar6 = (this->request).ptr.ptr;
  if (pMVar6 != (MallocMessageBuilder *)0x0) {
    (this->request).ptr.ptr = (MallocMessageBuilder *)0x0;
    pDVar2 = (this->request).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(code *)((long)(pMVar6->super_MessageBuilder).arenaSpace +
                              (long)((pMVar6->super_MessageBuilder)._vptr_MessageBuilder[-2] + -8)))
    ;
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

class LocalCallContext final: public CallContextHook, public kj::Refcounted {
public:
  LocalCallContext(kj::Own<MallocMessageBuilder>&& request, kj::Own<ClientHook> clientRef,
                   kj::Own<kj::PromiseFulfiller<void>> cancelAllowedFulfiller)
      : request(kj::mv(request)), clientRef(kj::mv(clientRef)),
        cancelAllowedFulfiller(kj::mv(cancelAllowedFulfiller)) {}

  AnyPointer::Reader getParams() override {
    KJ_IF_MAYBE(r, request) {
      return r->get()->getRoot<AnyPointer>();
    } else {
      KJ_FAIL_REQUIRE("Can't call getParams() after releaseParams().");
    }
  }
  void releaseParams() override {
    request = nullptr;
  }